

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  bool bVar1;
  CppType CVar2;
  uint32_t uVar3;
  string *psVar4;
  ArenaStringPtr *pAVar5;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetString",CPPTYPE_STRING);
  }
  this_00 = &this->schema_;
  if (((byte)field[1] & 8) != 0) {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    psVar4 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                        *(int *)(field + 4),*(string **)(field + 0x40));
    goto LAB_0039572e;
  }
  bVar1 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if ((!bVar1) || (bVar1 = HasOneofField(this,message,field), bVar1)) {
    bVar1 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
    if (bVar1) {
      psVar4 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
      goto LAB_0039572e;
    }
    pAVar5 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    psVar4 = (string *)((ulong)(pAVar5->tagged_ptr_).ptr_ & 0xfffffffffffffffe);
    if (psVar4 != (string *)0x0) goto LAB_0039572e;
  }
  psVar4 = *(string **)(field + 0x40);
LAB_0039572e:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return field->default_value_string();
    }
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        if (auto* value =
                GetField<ArenaStringPtr>(message, field).GetPointer()) {
          return *value;
        }
        return field->default_value_string();
      }
    }
  }
}